

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteColumnSizes
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this)

{
  int iVar1;
  int iVar2;
  FeederType *this_00;
  File *pFVar3;
  NLHeader *pNVar4;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *in_RDI;
  ColSizeWriter csw_1;
  ColSizeWriter csw;
  undefined4 in_stack_ffffffffffffffb0;
  ColSizeWriter local_48;
  ColSizeWriter local_28;
  
  this_00 = Feeder(in_RDI);
  iVar2 = NLFeeder<ExampleModel,_void_*>::WantColumnSizes((NLFeeder<ExampleModel,_void_*> *)this_00)
  ;
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      pFVar3 = &in_RDI->nm;
      pNVar4 = Hdr(in_RDI);
      iVar1 = (pNVar4->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      pNVar4 = Hdr(in_RDI);
      TextFormatter::apr(&in_RDI->super_FormatterType,pFVar3,
                         "k%d\t#intermediate Jacobian column lengths (cumulative)\n",
                         (ulong)((iVar1 + (pNVar4->super_NLProblemInfo).super_NLProblemInfo_C.
                                          num_rand_vars) - 1));
      ColSizeWriter::ColSizeWriter(&local_28,in_RDI,1);
      Feeder(in_RDI);
      ExampleNLFeeder::
      FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ColSizeWriter>
                ((ExampleNLFeeder *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                 (ColSizeWriter *)in_RDI);
    }
    else if (iVar2 == 2) {
      pFVar3 = &in_RDI->nm;
      pNVar4 = Hdr(in_RDI);
      iVar1 = (pNVar4->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      pNVar4 = Hdr(in_RDI);
      TextFormatter::apr(&in_RDI->super_FormatterType,pFVar3,
                         "K%d\t#intermediate Jacobian column lengths\n",
                         (ulong)((iVar1 + (pNVar4->super_NLProblemInfo).super_NLProblemInfo_C.
                                          num_rand_vars) - 1));
      ColSizeWriter::ColSizeWriter(&local_48,in_RDI,2);
      Feeder(in_RDI);
      ExampleNLFeeder::
      FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ColSizeWriter>
                ((ExampleNLFeeder *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                 (ColSizeWriter *)in_RDI);
    }
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteColumnSizes() {
  switch(Feeder().WantColumnSizes()) {
  case 1:
    apr(nm,
		#ifdef NL_LIB2_ORIG_HDR
				"k%d\t#intermediate Jacobian column lengths\n",
		#else
				"k%d\t#intermediate Jacobian column lengths (cumulative)\n",
		#endif
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 1);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 2:
    apr(nm, "K%d\t#intermediate Jacobian column lengths\n",
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 2);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 0:
    break;            // SKIP
  default:
    assert(0 && "why am I here?");
  }
}